

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O3

void __thiscall
pstore::serialize::archive::database_reader::getn<pstore::gsl::span<char,_1l>,void>
          (database_reader *this,span<char,__1L> span)

{
  extent_type<_1L> distance;
  code *local_38;
  void *local_30;
  
  distance = span.storage_.super_extent_type<_1L>.size_;
  address::operator+=(&this->addr_,0);
  if (-1 < distance.size_) {
    (*this->db_->_vptr_database[3])(&local_38,this->db_,(this->addr_).a_,distance.size_,1);
    address::operator+=(&this->addr_,distance.size_);
    if (distance.size_ != 0) {
      memmove(span.storage_.data_,local_30,distance.size_);
    }
    if (local_30 != (void *)0x0) {
      (*local_38)(local_30);
    }
    return;
  }
  assert_failed("t >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/archive.hpp"
                ,0x78);
}

Assistant:

void database_reader::getn (SpanType span) {
                using element_type = typename SpanType::element_type;

                // Adjust addr_ so that it is correctly aligned for element_type.
                auto const extra_for_alignment =
                    calc_alignment (addr_.absolute (), alignof (element_type));
                PSTORE_ASSERT (extra_for_alignment < sizeof (element_type));
                addr_ += extra_for_alignment;

                // Load the data.
                auto const size = unsigned_cast (span.size_bytes ());
                auto src = db_.getrou (typed_address<std::uint8_t> (addr_), size);
                addr_ += size;

                // Copy to the destination span.
                auto first = src.get ();
                std::copy (first, first + size, reinterpret_cast<std::uint8_t *> (span.data ()));
            }